

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O0

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                   (EnumValueDescriptor *descriptor,FileDescriptor *file,bool preSpace,
                   bool postNewline)

{
  byte in_CL;
  FileDescriptor *in_RDX;
  EnumValueDescriptor *in_RSI;
  string *in_RDI;
  byte in_R8B;
  FileDescriptor *sourceFile;
  string message;
  bool isFileLevelDeprecation;
  bool isDeprecated;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_stack_fffffffffffffeb8;
  string *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_120 [32];
  string local_100 [39];
  undefined1 local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  FileDescriptor *local_48;
  string local_40 [36];
  bool local_1c;
  bool local_1b;
  byte local_1a;
  byte local_19;
  FileDescriptor *local_18;
  EnumValueDescriptor *local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  __rhs_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  EnumValueDescriptor::options(in_RSI);
  local_1b = EnumValueOptions::deprecated((EnumValueOptions *)0x5a6107);
  local_1c = false;
  if ((!local_1b) && (local_18 != (FileDescriptor *)0x0)) {
    FileDescriptor::options(local_18);
    local_1c = FileOptions::deprecated((FileOptions *)0x5a6142);
    local_1b = local_1c;
  }
  if (local_1b == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&stack0xfffffffffffffede);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffede);
  }
  else {
    std::__cxx11::string::string(local_40);
    local_48 = EnumValueDescriptor::file((EnumValueDescriptor *)0x5a6183);
    if ((local_1c & 1U) == 0) {
      in_stack_fffffffffffffeb8 = EnumValueDescriptor::full_name_abi_cxx11_(local_10);
      std::operator+(in_stack_fffffffffffffed8,(char *)__rhs_00);
      FileDescriptor::name_abi_cxx11_(local_48);
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
      std::__cxx11::string::operator=(local_40,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_d8);
    }
    else {
      FileDescriptor::name_abi_cxx11_(local_48);
      std::operator+(in_stack_fffffffffffffed8,(char *)__rhs_00);
      std::__cxx11::string::operator=(local_40,local_78);
      std::__cxx11::string::~string(local_78);
    }
    local_d9 = 0;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffedf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"GPB_DEPRECATED_MSG(\"",(allocator *)__rhs);
    std::operator+(in_stack_fffffffffffffeb8,__rhs);
    std::operator+(in_stack_fffffffffffffeb8,(char *)__rhs);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
    if ((local_19 & 1) != 0) {
      std::__cxx11::string::insert((ulong)in_RDI,(char *)0x0);
    }
    if ((local_1a & 1) != 0) {
      std::__cxx11::string::append((char *)in_RDI);
    }
    local_d9 = 1;
    std::__cxx11::string::~string(local_40);
  }
  return __rhs_00;
}

Assistant:

string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor,
    const FileDescriptor* file = NULL,
    bool preSpace = true, bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = sourceFile->name() + " is deprecated.";
    } else {
      message = descriptor->full_name() + " is deprecated (see " +
                sourceFile->name() + ").";
    }

    string result = string("GPB_DEPRECATED_MSG(\"") + message + "\")";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}